

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeSize_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type)

{
  if (type->base_type - BASE_TYPE_UTYPE < 0xc) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,type,false);
  }
  else if ((type->base_type == BASE_TYPE_STRUCT) && (type->struct_def->fixed == true)) {
    GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,type);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"::flatbuffers::uoffset_t","");
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeSize(const Type &type) const {
    if (IsScalar(type.base_type)) {
      return GenTypeBasic(type, false);
    } else if (IsStruct(type)) {
      return GenTypePointer(type);
    } else {
      return "::flatbuffers::uoffset_t";
    }
  }